

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_read_fits_region(fitsfile *fptr,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  int iVar1;
  fitsfile *fptr_00;
  FITSfile *pFVar2;
  void *pvVar3;
  SAORegion *in_RCX;
  undefined8 *in_RDX;
  int *in_RSI;
  double dVar4;
  WCSdata *regwcs;
  RgnShape *newShape;
  SAORegion *aRgn;
  int shapetype [17];
  char shapename [17] [71];
  char colname [6] [71];
  char comment [73];
  char *cvalue2;
  char *cvalue;
  double *coords;
  double Ypos;
  double Xpos;
  double Ysave;
  double Xsave;
  double Theta;
  double Y;
  double X;
  long icsize [6];
  int tstatus;
  int got_component;
  int dotransform;
  int npos;
  int anynul;
  int idum;
  int icol [6];
  int j;
  int i;
  SAORegion *in_stack_fffffffffffff790;
  SAORegion *in_stack_fffffffffffff798;
  int *in_stack_fffffffffffff7a0;
  char *in_stack_fffffffffffff7a8;
  SAORegion *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  double in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  RgnShape *newShape_00;
  double *in_stack_fffffffffffff7d8;
  int *firstrow;
  int in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7ec;
  fitsfile *in_stack_fffffffffffff7f0;
  int *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  int in_stack_fffffffffffff804;
  int *in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  fitsfile *in_stack_fffffffffffff818;
  double *in_stack_fffffffffffff820;
  double *in_stack_fffffffffffff828;
  char *in_stack_fffffffffffff830;
  int *in_stack_fffffffffffff838;
  long *in_stack_fffffffffffff840;
  int *in_stack_fffffffffffff848;
  int in_stack_fffffffffffff850;
  int in_stack_fffffffffffff854;
  fitsfile *in_stack_fffffffffffff858;
  int *in_stack_fffffffffffff940;
  double *in_stack_fffffffffffff948;
  double *in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  double in_stack_fffffffffffff960;
  double in_stack_fffffffffffff968;
  double in_stack_fffffffffffff970;
  double in_stack_fffffffffffff978;
  double in_stack_fffffffffffff980;
  double in_stack_fffffffffffff988;
  double in_stack_fffffffffffff990;
  double in_stack_fffffffffffff998;
  double in_stack_fffffffffffff9b0;
  int *in_stack_fffffffffffff9f0;
  double *in_stack_fffffffffffff9f8;
  double *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  double in_stack_fffffffffffffa10;
  double in_stack_fffffffffffffa18;
  double in_stack_fffffffffffffa20;
  double in_stack_fffffffffffffa28;
  double in_stack_fffffffffffffa30;
  double in_stack_fffffffffffffa38;
  double in_stack_fffffffffffffa40;
  double in_stack_fffffffffffffa48;
  double in_stack_fffffffffffffa60;
  undefined1 local_308 [512];
  char *local_108;
  char *local_100;
  LONGLONG *local_f8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  long local_b8;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  SAORegion local_70;
  
  local_7c = 1;
  local_d8 = 0.0;
  local_e0 = 0.0;
  local_70.wcs.yrefpix = (double)in_RCX;
  local_70.wcs.xinc = (double)in_RDX;
  local_70.wcs.yinc = (double)in_RSI;
  memcpy(local_308,&DAT_00282c80,0x1aa);
  memcpy(&stack0xfffffffffffff838,"POINT",0x4b7);
  memcpy(&stack0xfffffffffffff7e8,&DAT_002832f0,0x44);
  newShape_00 = (RgnShape *)0x0;
  if (*(int *)local_70.wcs.yrefpix != 0) {
    return *(int *)local_70.wcs.yrefpix;
  }
  fptr_00 = (fitsfile *)malloc(0x58);
  if (fptr_00 == (fitsfile *)0x0) {
    ffpmsg((char *)0x251ec6);
    *(int *)local_70.wcs.yrefpix = 0x71;
    return 0x71;
  }
  fptr_00->HDUposition = 0;
  fptr_00->Fptr = (FITSfile *)0x0;
  if (((int *)local_70.wcs.yinc == (int *)0x0) || (*(int *)local_70.wcs.yinc == 0)) {
    fptr_00[1].HDUposition = 0;
  }
  else {
    memcpy(fptr_00 + 1,(void *)local_70.wcs.yinc,0x48);
  }
  local_80 = 0;
  for (local_70.wcs.xrefpix._4_4_ = 0; local_70.wcs.xrefpix._4_4_ < 5;
      local_70.wcs.xrefpix._4_4_ = local_70.wcs.xrefpix._4_4_ + 1) {
    ffgcno(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,(char *)fptr_00,
           (int *)in_stack_fffffffffffff7d8,(int *)newShape_00);
  }
  if ((local_80 == 0) ||
     (iVar1 = ffmnhd(in_stack_fffffffffffff818,in_stack_fffffffffffff814,
                     (char *)in_stack_fffffffffffff808,in_stack_fffffffffffff804,
                     in_stack_fffffffffffff7f8), iVar1 == 0)) {
    iVar1 = ffgky((fitsfile *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                  (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20),
                  (char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                  in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
    if (iVar1 == 0) {
      pFVar2 = (FITSfile *)malloc((long)fptr_00->HDUposition * 0xa8);
      fptr_00->Fptr = pFVar2;
      if (fptr_00->Fptr == (FITSfile *)0x0) {
        ffpmsg((char *)0x252079);
        *(int *)local_70.wcs.yrefpix = 0x71;
      }
      else {
        for (local_70.wcs.xrefpix._4_4_ = 0; local_70.wcs.xrefpix._4_4_ < 5;
            local_70.wcs.xrefpix._4_4_ = local_70.wcs.xrefpix._4_4_ + 1) {
          iVar1 = ffgcno(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,(char *)fptr_00,
                         (int *)in_stack_fffffffffffff7d8,(int *)newShape_00);
          if (iVar1 != 0) {
            ffpmsg((char *)0x2520f7);
            goto LAB_00253168;
          }
        }
        iVar1 = ffgcno(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,(char *)fptr_00,
                       (int *)in_stack_fffffffffffff7d8,(int *)newShape_00);
        if (iVar1 != 0) {
          local_7c = 0;
        }
        local_78 = 0;
        if (fptr_00[1].HDUposition != 0) {
          newShape_00 = (RgnShape *)malloc(0x48);
          if (newShape_00 == (RgnShape *)0x0) {
            ffpmsg((char *)0x252190);
            *(int *)local_70.wcs.yrefpix = 0x71;
            goto LAB_00253168;
          }
          *(undefined4 *)newShape_00 = 1;
          in_stack_fffffffffffff790 = (SAORegion *)&newShape_00->ymax;
          in_stack_fffffffffffff798 = (SAORegion *)&newShape_00->param;
          in_stack_fffffffffffff7b0 = (SAORegion *)local_70.wcs.yrefpix;
          iVar1 = ffgtcs(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
                         in_stack_fffffffffffff7e8,(double *)fptr_00,in_stack_fffffffffffff7d8,
                         (double *)newShape_00,
                         (double *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                         (double *)in_stack_fffffffffffff818,in_stack_fffffffffffff820,
                         in_stack_fffffffffffff828,in_stack_fffffffffffff830,
                         in_stack_fffffffffffff838);
          if (iVar1 != 0) {
            *(int *)newShape_00 = 0;
            *(int *)local_70.wcs.yrefpix = 0;
          }
          if (((*(int *)newShape_00 != 0) && (*(int *)local_70.wcs.yinc != 0)) &&
             ((((1e-06 < ABS(*(double *)&newShape_00->comp -
                             *(double *)((long)local_70.wcs.yinc + 8)) ||
                ((((1e-06 < ABS(newShape_00->xmin - *(double *)((long)local_70.wcs.yinc + 0x10)) ||
                   (1e-06 < ABS(newShape_00->xmax - *(double *)((long)local_70.wcs.yinc + 0x18))))
                  || (1e-06 < ABS(newShape_00->ymin - *(double *)((long)local_70.wcs.yinc + 0x20))))
                 || ((1e-06 < ABS(newShape_00->ymax - *(double *)((long)local_70.wcs.yinc + 0x28))
                     || (1e-06 < ABS((newShape_00->param).gen.p[0] -
                                     *(double *)((long)local_70.wcs.yinc + 0x30)))))))) ||
               (1e-06 < ABS((newShape_00->param).gen.p[1] -
                            *(double *)((long)local_70.wcs.yinc + 0x38)))) ||
              (iVar1 = strcmp((char *)((long)&newShape_00->param + 0x10),
                              (char *)((long)local_70.wcs.yinc + 0x40)), iVar1 == 0)))) {
            local_78 = 1;
          }
        }
        for (local_70.wcs.xrefpix._4_4_ = 0; local_70.wcs.xrefpix._4_4_ < 6;
            local_70.wcs.xrefpix._4_4_ = local_70.wcs.xrefpix._4_4_ + 1) {
          iVar1 = ffgtdm(in_stack_fffffffffffff858,in_stack_fffffffffffff854,
                         in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                         in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          if (iVar1 != 0) {
            ffpmsg((char *)0x25246f);
            goto LAB_00253168;
          }
        }
        local_100 = (char *)malloc(0x48);
        for (local_70.wcs.xrefpix._4_4_ = 1; local_70.wcs.xrefpix._4_4_ <= fptr_00->HDUposition;
            local_70.wcs.xrefpix._4_4_ = local_70.wcs.xrefpix._4_4_ + 1) {
          firstrow = &fptr_00->Fptr->filehandle + (long)(local_70.wcs.xrefpix._4_4_ + -1) * 0x2a;
          for (local_70.wcs.xrefpix._0_4_ = 0; local_70.wcs.xrefpix._0_4_ < 8;
              local_70.wcs.xrefpix._0_4_ = local_70.wcs.xrefpix._0_4_ + 1) {
            *(undefined8 *)(firstrow + (long)local_70.wcs.xrefpix._0_4_ * 2 + 0xc) = 0;
          }
          *(LONGLONG *)(firstrow + 0x26) = 0;
          *(LONGLONG *)(firstrow + 0x28) = 0;
          *(LONGLONG *)(firstrow + 0x22) = 0;
          *(undefined8 *)(firstrow + 0x24) = 0;
          in_stack_fffffffffffff790 = &local_70;
          in_stack_fffffffffffff798 = (SAORegion *)local_70.wcs.yrefpix;
          iVar1 = ffgcvs(fptr_00,(int)((ulong)firstrow >> 0x20),(LONGLONG)newShape_00,
                         CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                         (LONGLONG)in_stack_fffffffffffff7c0,
                         (char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                         (char **)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                         in_stack_fffffffffffff808,
                         (int *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
          if (iVar1 != 0) {
            ffpmsg((char *)0x2525c0);
            break;
          }
          *(undefined1 *)firstrow = 1;
          local_108 = local_100;
          iVar1 = strncmp(local_100,"!",1);
          if (iVar1 == 0) {
            *(undefined1 *)firstrow = 0;
            local_108 = local_108 + 1;
          }
          for (local_70.wcs.xrefpix._0_4_ = 0; local_70.wcs.xrefpix._0_4_ < 0x11;
              local_70.wcs.xrefpix._0_4_ = local_70.wcs.xrefpix._0_4_ + 1) {
            iVar1 = strcmp(local_108,
                           &stack0xfffffffffffff838 + (long)local_70.wcs.xrefpix._0_4_ * 0x47);
            if (iVar1 == 0) {
              firstrow[1] = *(int *)(&stack0xfffffffffffff7e8 + (long)local_70.wcs.xrefpix._0_4_ * 4
                                    );
            }
          }
          if (firstrow[1] == 0xb) {
            pvVar3 = calloc(local_b8 << 1,8);
            *(void **)(firstrow + 0xe) = pvVar3;
            if (*(long *)(firstrow + 0xe) == 0) {
              ffpmsg((char *)0x2526c2);
              *(int *)local_70.wcs.yrefpix = 0x71;
              break;
            }
            firstrow[0xc] = (int)(local_b8 << 1);
            local_f8 = *(LONGLONG **)(firstrow + 0xe);
          }
          else {
            local_f8 = (LONGLONG *)(firstrow + 0xc);
          }
          local_74 = 1;
          if (firstrow[1] == 0xb) {
            local_74 = (int)*(LONGLONG *)(firstrow + 0xc) / 2;
          }
          if (firstrow[1] == 8) {
            local_74 = 2;
          }
          for (local_70.wcs.xrefpix._0_4_ = 0; local_70.wcs.xrefpix._0_4_ < local_74;
              local_70.wcs.xrefpix._0_4_ = local_70.wcs.xrefpix._0_4_ + 1) {
            in_stack_fffffffffffff790 = (SAORegion *)local_70.wcs.yrefpix;
            iVar1 = ffgcvd((fitsfile *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                           ,(int)((ulong)fptr_00 >> 0x20),(LONGLONG)firstrow,(LONGLONG)newShape_00,
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           in_stack_fffffffffffff7c0,
                           (double *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                           (int *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                           in_stack_fffffffffffff808);
            if (iVar1 != 0) {
              ffpmsg((char *)0x2527d9);
              goto LAB_00253168;
            }
            if (((double)*local_f8 == -9.1191291391491e-36) && (!NAN((double)*local_f8))) {
              local_74 = local_70.wcs.xrefpix._0_4_;
              firstrow[0xc] = local_70.wcs.xrefpix._0_4_ << 1;
              break;
            }
            local_f8 = local_f8 + 1;
            in_stack_fffffffffffff790 = (SAORegion *)local_70.wcs.yrefpix;
            iVar1 = ffgcvd((fitsfile *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                           ,(int)((ulong)fptr_00 >> 0x20),(LONGLONG)firstrow,(LONGLONG)newShape_00,
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           in_stack_fffffffffffff7c0,
                           (double *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                           (int *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                           in_stack_fffffffffffff808);
            if (iVar1 != 0) {
              ffpmsg((char *)0x25289b);
              goto LAB_00253168;
            }
            if (((double)*local_f8 == -9.1191291391491e-36) && (!NAN((double)*local_f8))) {
              local_74 = local_70.wcs.xrefpix._0_4_;
              firstrow[0xc] = local_70.wcs.xrefpix._0_4_ << 1;
              local_f8 = local_f8 + -1;
              break;
            }
            if (local_70.wcs.xrefpix._0_4_ == 0) {
              local_d8 = (double)local_f8[-1];
              local_e0 = (double)*local_f8;
            }
            else if ((local_d8 == (double)local_f8[-1]) &&
                    (!NAN(local_d8) && !NAN((double)local_f8[-1]))) {
              if ((local_e0 == (double)*local_f8) && (!NAN(local_e0) && !NAN((double)*local_f8))) {
                local_74 = local_70.wcs.xrefpix._0_4_ + 1;
                firstrow[0xc] = local_74 * 2;
                local_f8 = local_f8 + 1;
                break;
              }
            }
            local_f8 = local_f8 + 1;
          }
          if (local_78 != 0) {
            local_f8 = local_f8 + -(long)(local_74 << 1);
            local_d8 = (double)*local_f8;
            local_e0 = (double)local_f8[1];
            for (local_70.wcs.xrefpix._0_4_ = 0; local_70.wcs.xrefpix._0_4_ < local_74;
                local_70.wcs.xrefpix._0_4_ = local_70.wcs.xrefpix._0_4_ + 1) {
              ffwldp(in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                     in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                     in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff9b0,
                     in_stack_fffffffffffff958,in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                     in_stack_fffffffffffff940);
              ffxypx(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                     in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa60,
                     in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                     in_stack_fffffffffffff9f0);
              if (*(int *)local_70.wcs.yrefpix != 0) {
                ffpmsg((char *)0x252bb7);
                goto LAB_00253168;
              }
            }
            local_f8 = local_f8 + (local_74 << 1);
          }
          local_74 = 0;
          in_stack_fffffffffffff7cc = firstrow[1];
          if (in_stack_fffffffffffff7cc == 2) {
            local_74 = 1;
          }
          else {
            if (1 < in_stack_fffffffffffff7cc - 3U) {
              if (in_stack_fffffffffffff7cc == 5) {
LAB_00252c6c:
                local_74 = 4;
                goto LAB_00252c7b;
              }
              if (in_stack_fffffffffffff7cc != 6) {
                if (in_stack_fffffffffffff7cc == 7) goto LAB_00252c6c;
                if (1 < in_stack_fffffffffffff7cc - 9U) goto LAB_00252c7b;
              }
            }
            local_74 = 2;
          }
LAB_00252c7b:
          if (local_74 != 0) {
            in_stack_fffffffffffff790 = (SAORegion *)local_70.wcs.yrefpix;
            iVar1 = ffgcvd((fitsfile *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                           ,(int)((ulong)fptr_00 >> 0x20),(LONGLONG)firstrow,(LONGLONG)newShape_00,
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           in_stack_fffffffffffff7c0,
                           (double *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                           (int *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                           in_stack_fffffffffffff808);
            if (iVar1 != 0) {
              ffpmsg((char *)0x252ce7);
              break;
            }
            if (local_78 == 0) {
              local_f8 = local_f8 + local_74;
            }
            else {
              for (local_70.wcs.xrefpix._0_4_ = 0; local_70.wcs.xrefpix._0_4_ < local_74;
                  local_70.wcs.xrefpix._0_4_ = local_70.wcs.xrefpix._0_4_ + 1) {
                local_c8 = local_e0 + (double)*local_f8;
                local_c0 = local_d8;
                ffwldp(in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988
                       ,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                       in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960
                       ,in_stack_fffffffffffff9b0,in_stack_fffffffffffff958,
                       in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940
                      );
                ffxypx(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
                       ,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                       in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10
                       ,in_stack_fffffffffffffa60,in_stack_fffffffffffffa08,
                       in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0
                      );
                if (*(int *)local_70.wcs.yrefpix != 0) {
                  ffpmsg((char *)0x252e84);
                  goto LAB_00253168;
                }
                in_stack_fffffffffffff7c0 = pow(local_c0 - *(double *)(firstrow + 0xc),2.0);
                dVar4 = pow(local_c8 - *(double *)(firstrow + 0xe),2.0);
                dVar4 = sqrt(in_stack_fffffffffffff7c0 + dVar4);
                *local_f8 = (LONGLONG)dVar4;
                local_f8 = local_f8 + 1;
              }
            }
          }
          local_74 = 0;
          in_stack_fffffffffffff7bc = firstrow[1];
          if (in_stack_fffffffffffff7bc == 4) {
LAB_00252f8c:
            local_74 = 1;
          }
          else if (in_stack_fffffffffffff7bc == 5) {
LAB_00252f99:
            local_74 = 2;
          }
          else {
            if (in_stack_fffffffffffff7bc == 6) goto LAB_00252f8c;
            if (in_stack_fffffffffffff7bc == 7) goto LAB_00252f99;
            if (in_stack_fffffffffffff7bc == 9) goto LAB_00252f8c;
            if (in_stack_fffffffffffff7bc == 10) goto LAB_00252f99;
          }
          if (local_74 != 0) {
            in_stack_fffffffffffff790 = (SAORegion *)local_70.wcs.yrefpix;
            iVar1 = ffgcvd((fitsfile *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                           ,(int)((ulong)fptr_00 >> 0x20),(LONGLONG)firstrow,(LONGLONG)newShape_00,
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           in_stack_fffffffffffff7c0,
                           (double *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                           (int *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                           in_stack_fffffffffffff808);
            if (iVar1 != 0) {
              ffpmsg((char *)0x253014);
              break;
            }
            if (local_78 == 0) {
              local_f8 = local_f8 + local_74;
            }
            else {
              local_d0 = *(double *)((long)local_70.wcs.yinc + 0x38) - (newShape_00->param).gen.p[1]
              ;
              for (local_70.wcs.xrefpix._0_4_ = 0; local_70.wcs.xrefpix._0_4_ < local_74;
                  local_70.wcs.xrefpix._0_4_ = local_70.wcs.xrefpix._0_4_ + 1) {
                *local_f8 = (LONGLONG)(local_d0 + (double)*local_f8);
                local_f8 = local_f8 + 1;
              }
            }
          }
          if (local_7c == 0) {
            firstrow[2] = 1;
          }
          else {
            in_stack_fffffffffffff790 = (SAORegion *)(firstrow + 2);
            in_stack_fffffffffffff798 = &local_70;
            iVar1 = ffgcv(fptr_00,(int)((ulong)firstrow >> 0x20),(int)firstrow,(LONGLONG)newShape_00
                          ,CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                          (LONGLONG)in_stack_fffffffffffff7c0,
                          (void *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                          in_stack_fffffffffffff818,(int *)in_stack_fffffffffffff820,
                          (int *)in_stack_fffffffffffff828);
            if (iVar1 != 0) {
              ffpmsg((char *)0x253136);
              break;
            }
          }
          fits_setup_shape(newShape_00);
        }
      }
    }
    else {
      ffpmsg((char *)0x25203c);
    }
  }
  else {
    ffpmsg((char *)0x251ff6);
  }
LAB_00253168:
  if (*(int *)local_70.wcs.yrefpix == 0) {
    *(fitsfile **)local_70.wcs.xinc = fptr_00;
  }
  else {
    fits_free_region(in_stack_fffffffffffff7b0);
  }
  ffclos((fitsfile *)in_stack_fffffffffffff798,&in_stack_fffffffffffff790->nShapes);
  return *(int *)local_70.wcs.yrefpix;
}

Assistant:

int fits_read_fits_region ( fitsfile *fptr, 
			    WCSdata *wcs, 
			    SAORegion **Rgn, 
			    int *status)
/*  Read regions from a FITS region extension and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{

  int i, j, icol[6], idum, anynul, npos;
  int dotransform, got_component = 1, tstatus;
  long icsize[6];
  double X, Y, Theta, Xsave = 0, Ysave = 0, Xpos, Ypos;
  double *coords;
  char *cvalue, *cvalue2;
  char comment[FLEN_COMMENT];
  char colname[6][FLEN_VALUE] = {"X", "Y", "SHAPE", "R", "ROTANG", "COMPONENT"};
  char shapename[17][FLEN_VALUE] = {"POINT","CIRCLE","ELLIPSE","ANNULUS",
				    "ELLIPTANNULUS","BOX","ROTBOX","BOXANNULUS",
				    "RECTANGLE","ROTRECTANGLE","POLYGON","PIE",
				    "SECTOR","DIAMOND","RHOMBUS","ROTDIAMOND",
				    "ROTRHOMBUS"};
  int shapetype[17] = {point_rgn, circle_rgn, ellipse_rgn, annulus_rgn, 
		       elliptannulus_rgn, box_rgn, box_rgn, boxannulus_rgn, 
		       rectangle_rgn, rectangle_rgn, poly_rgn, sector_rgn, 
		       sector_rgn, diamond_rgn, diamond_rgn, diamond_rgn, 
		       diamond_rgn};
  SAORegion *aRgn;
  RgnShape *newShape;
  WCSdata *regwcs = 0;

  if ( *status ) return( *status );

  aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
  if( ! aRgn ) {
    ffpmsg("Couldn't allocate memory to hold Region file contents.");
    return(*status = MEMORY_ALLOCATION );
  }
  aRgn->nShapes    =    0;
  aRgn->Shapes     = NULL;
  if( wcs && wcs->exists )
    aRgn->wcs = *wcs;
  else
    aRgn->wcs.exists = 0;

  /* See if we are already positioned to a region extension, else */
  /* move to the REGION extension (file is already open). */

  tstatus = 0;
  for (i=0; i<5; i++) {
    ffgcno(fptr, CASEINSEN, colname[i], &icol[i], &tstatus);
  }

  if (tstatus) {
    /* couldn't find the required columns, so search for "REGION" extension */
    if ( ffmnhd(fptr, BINARY_TBL, "REGION", 1, status) ) {
      ffpmsg("Could not move to REGION extension.");
      goto error;
    }
  }

  /* get the number of shapes and allocate memory */

  if ( ffgky(fptr, TINT, "NAXIS2", &aRgn->nShapes, comment, status) ) {
    ffpmsg("Could not read NAXIS2 keyword.");
    goto error;
  }

  aRgn->Shapes = (RgnShape *) malloc(aRgn->nShapes * sizeof(RgnShape));
  if ( !aRgn->Shapes ) {
    ffpmsg( "Failed to allocate memory for Region data");
    *status = MEMORY_ALLOCATION;
    goto error;
  }

  /* get the required column numbers */

  for (i=0; i<5; i++) {
    if ( ffgcno(fptr, CASEINSEN, colname[i], &icol[i], status) ) {
      ffpmsg("Could not find column.");
      goto error;
    }
  }

  /* try to get the optional column numbers */

  if ( ffgcno(fptr, CASEINSEN, colname[5], &icol[5], status) ) {
       got_component = 0;
  }

  /* if there was input WCS then read the WCS info for the region in case they */
  /* are different and we have to transform */

  dotransform = 0;
  if ( aRgn->wcs.exists ) {
    regwcs = (WCSdata *) malloc ( sizeof(WCSdata) );
    if ( !regwcs ) {
      ffpmsg( "Failed to allocate memory for Region WCS data");
      *status = MEMORY_ALLOCATION;
      goto error;
    }

    regwcs->exists = 1;
    if ( ffgtcs(fptr, icol[0], icol[1], &regwcs->xrefval,  &regwcs->yrefval,
		&regwcs->xrefpix, &regwcs->yrefpix, &regwcs->xinc, &regwcs->yinc,
		&regwcs->rot, regwcs->type, status) ) {
      regwcs->exists = 0;
      *status = 0;
    }

    if ( regwcs->exists && wcs->exists ) {
      if ( fabs(regwcs->xrefval-wcs->xrefval) > 1.0e-6 ||
	   fabs(regwcs->yrefval-wcs->yrefval) > 1.0e-6 ||
	   fabs(regwcs->xrefpix-wcs->xrefpix) > 1.0e-6 ||
	   fabs(regwcs->yrefpix-wcs->yrefpix) > 1.0e-6 ||
	   fabs(regwcs->xinc-wcs->xinc) > 1.0e-6 ||
	   fabs(regwcs->yinc-wcs->yinc) > 1.0e-6 ||
	   fabs(regwcs->rot-wcs->rot) > 1.0e-6 ||
	   !strcmp(regwcs->type,wcs->type) ) dotransform = 1;
    }
  }

  /* get the sizes of the X, Y, R, and ROTANG vectors */

  for (i=0; i<6; i++) {
    if ( ffgtdm(fptr, icol[i], 1, &idum, &icsize[i], status) ) {
      ffpmsg("Could not find vector size of column.");
      goto error;
    }
  }

  cvalue = (char *) malloc ((FLEN_VALUE+1)*sizeof(char));

  /* loop over the shapes - note 1-based counting for rows in FITS files */

  for (i=1; i<=aRgn->nShapes; i++) {

    newShape = &aRgn->Shapes[i-1];
    for (j=0; j<8; j++) newShape->param.gen.p[j] = 0.0;
    newShape->param.gen.a = 0.0;
    newShape->param.gen.b = 0.0;
    newShape->param.gen.sinT = 0.0;
    newShape->param.gen.cosT = 0.0;

    /* get the shape */

    if ( ffgcvs(fptr, icol[2], i, 1, 1, " ", &cvalue, &anynul, status) ) {
      ffpmsg("Could not read shape.");
      goto error;
    }

    /* set include or exclude */

    newShape->sign = 1;
    cvalue2 = cvalue;
    if ( !strncmp(cvalue,"!",1) ) {
      newShape->sign = 0;
      cvalue2++;
    }

    /* set the shape type */

    for (j=0; j<17; j++) {
      if ( !strcmp(cvalue2, shapename[j]) ) newShape->shape = shapetype[j];
    }

    /* allocate memory for polygon case and set coords pointer */

    if ( newShape->shape == poly_rgn ) {
      newShape->param.poly.Pts = (double *) calloc (2*icsize[0], sizeof(double));
      if ( !newShape->param.poly.Pts ) {
	ffpmsg("Could not allocate memory to hold polygon parameters" );
	*status = MEMORY_ALLOCATION;
	goto error;
      }
      newShape->param.poly.nPts = 2*icsize[0];
      coords = newShape->param.poly.Pts;
    } else {
      coords = newShape->param.gen.p;
    }


  /* read X and Y. Polygon and Rectangle require special cases */

    npos = 1;
    if ( newShape->shape == poly_rgn ) npos = newShape->param.poly.nPts/2;
    if ( newShape->shape == rectangle_rgn ) npos = 2;

    for (j=0; j<npos; j++) {
      if ( ffgcvd(fptr, icol[0], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read X column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) {  /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
      coords++;
      
      if ( ffgcvd(fptr, icol[1], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read Y column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) { /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
        coords--;
	break;
      }
      coords++;
 
      if (j == 0) {  /* save the first X and Y coordinate */
        Xsave = *(coords - 2);
	Ysave = *(coords - 1);
      } else if ((Xsave == *(coords - 2)) && (Ysave == *(coords - 1)) ) {
        /* if point has same coordinate as first point, this marks the end of the array */
        npos = j + 1;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
    }

    /* transform positions if the region and input wcs differ */

    if ( dotransform ) {

      coords -= npos*2;
      Xsave = coords[0];
      Ysave = coords[1];
      for (j=0; j<npos; j++) {
	ffwldp(coords[2*j], coords[2*j+1], regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
	       regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
	       regwcs->type, &Xpos, &Ypos, status);
	ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
	       wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
	       wcs->type, &coords[2*j], &coords[2*j+1], status);
	if ( *status ) {
	  ffpmsg("Failed to transform coordinates");
	  goto error;
	}
      }
      coords += npos*2;
    }

  /* read R. Circle requires one number; Box, Diamond, Ellipse, Annulus, Sector 
     and Panda two; Boxannulus and Elliptannulus four; Point, Rectangle and 
     Polygon none. */

    npos = 0;
    switch ( newShape->shape ) {
    case circle_rgn: 
      npos = 1;
      break;
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
    case annulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
      npos = 4;
      break;
    default:
      break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[3], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read R column for region");
	goto error;
      }

    /* transform lengths if the region and input wcs differ */

      if ( dotransform ) {
	for (j=0; j<npos; j++) {
	  Y = Ysave + (*coords);
	  X = Xsave;
	  ffwldp(X, Y, regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
		 regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
		 regwcs->type, &Xpos, &Ypos, status);
	  ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
		 wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
		 wcs->type, &X, &Y, status);
	  if ( *status ) {
	    ffpmsg("Failed to transform coordinates");
	    goto error;
	  }
	  *(coords++) = sqrt(pow(X-newShape->param.gen.p[0],2)+pow(Y-newShape->param.gen.p[1],2));
	}
      } else {
	coords += npos;
      }
    }

  /* read ROTANG. Requires two values for Boxannulus, Elliptannulus, Sector, 
     Panda; one for Box, Diamond, Ellipse; and none for Circle, Point, Annulus, 
     Rectangle, Polygon */

    npos = 0;
    switch ( newShape->shape ) {
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
      npos = 1;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    default:
     break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[4], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read ROTANG column for region");
	goto error;
      }

    /* transform angles if the region and input wcs differ */

      if ( dotransform ) {
	Theta = (wcs->rot) - (regwcs->rot);
	for (j=0; j<npos; j++) *(coords++) += Theta;
      } else {
	coords += npos;
      }
    }

  /* read the component number */

    if (got_component) {
      if ( ffgcv(fptr, TINT, icol[5], i, 1, 1, 0, &newShape->comp, &anynul, status) ) {
        ffpmsg("Failed to read COMPONENT column for region");
        goto error;
      }
    } else {
      newShape->comp = 1;
    }


    /* do some precalculations to speed up tests */

    fits_setup_shape(newShape);

    /* end loop over shapes */

  }

error:

   if( *status )
      fits_free_region( aRgn );
   else
      *Rgn = aRgn;

   ffclos(fptr, status);

   return( *status );
}